

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit_pushdown.cpp
# Opt level: O0

bool duckdb::LimitPushdown::CanOptimize(LogicalOperator *op)

{
  LimitNodeType LVar1;
  pointer pLVar2;
  LogicalLimit *pLVar3;
  idx_t iVar4;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *in_RDI;
  LogicalLimit *limit;
  LogicalOperator *in_stack_00000030;
  size_type in_stack_ffffffffffffffe8;
  
  if (*(char *)&(in_RDI->
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish == '\x06') {
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
    ::operator[](in_RDI,in_stack_ffffffffffffffe8);
    pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)in_RDI);
    if (pLVar2->type == LOGICAL_PROJECTION) {
      pLVar3 = LogicalOperator::Cast<duckdb::LogicalLimit>(in_stack_00000030);
      LVar1 = BoundLimitNode::Type(&pLVar3->offset_val);
      if ((LVar1 == EXPRESSION_PERCENTAGE) ||
         (LVar1 = BoundLimitNode::Type(&pLVar3->offset_val), LVar1 == EXPRESSION_VALUE)) {
        return false;
      }
      LVar1 = BoundLimitNode::Type(&pLVar3->limit_val);
      if ((LVar1 == CONSTANT_VALUE) &&
         (iVar4 = BoundLimitNode::GetConstantValue((BoundLimitNode *)in_stack_00000030),
         iVar4 < 0x2000)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool LimitPushdown::CanOptimize(duckdb::LogicalOperator &op) {
	if (op.type == LogicalOperatorType::LOGICAL_LIMIT &&
	    op.children[0]->type == LogicalOperatorType::LOGICAL_PROJECTION) {
		auto &limit = op.Cast<LogicalLimit>();

		if (limit.offset_val.Type() == LimitNodeType::EXPRESSION_PERCENTAGE ||
		    limit.offset_val.Type() == LimitNodeType::EXPRESSION_VALUE) {
			// Offset cannot be an expression
			return false;
		}

		if (limit.limit_val.Type() == LimitNodeType::CONSTANT_VALUE && limit.limit_val.GetConstantValue() < 8192) {
			// Push down only when limit value is smaller than 8192.
			// when physical_limit is introduced, it will end a parallel pipeline
			// restrict the limit value to be small so that remaining operations run fast without parallelization.
			return true;
		}
	}
	return false;
}